

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DbFreeNN(sqlite3 *db,void *p)

{
  uint uVar1;
  
  if (db == (sqlite3 *)0x0) {
LAB_001315c0:
    sqlite3_free(p);
    return;
  }
  if (p < (db->lookaside).pEnd) {
    if ((db->lookaside).pMiddle <= p) {
      *(LookasideSlot **)p = (db->lookaside).pSmallFree;
      (db->lookaside).pSmallFree = (LookasideSlot *)p;
      return;
    }
    if ((db->lookaside).pStart <= p) {
      *(LookasideSlot **)p = (db->lookaside).pFree;
      (db->lookaside).pFree = (LookasideSlot *)p;
      return;
    }
  }
  if (db->pnBytesFreed == (int *)0x0) goto LAB_001315c0;
  if ((db != (sqlite3 *)0x0) && (p < (db->lookaside).pTrueEnd)) {
    uVar1 = 0x80;
    if ((db->lookaside).pMiddle <= p) goto LAB_0013161e;
    if ((db->lookaside).pStart <= p) {
      uVar1 = (uint)(db->lookaside).szTrue;
      goto LAB_0013161e;
    }
  }
  uVar1 = (*sqlite3Config.m.xSize)(p);
LAB_0013161e:
  *db->pnBytesFreed = *db->pnBytesFreed + uVar1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DbFreeNN(sqlite3 *db, void *p){
  assert( db==0 || sqlite3_mutex_held(db->mutex) );
  assert( p!=0 );
  if( db ){
    if( ((uptr)p)<(uptr)(db->lookaside.pEnd) ){
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
      if( ((uptr)p)>=(uptr)(db->lookaside.pMiddle) ){
        LookasideSlot *pBuf = (LookasideSlot*)p;
        assert( db->pnBytesFreed==0 );
#ifdef SQLITE_DEBUG
        memset(p, 0xaa, LOOKASIDE_SMALL);  /* Trash freed content */
#endif
        pBuf->pNext = db->lookaside.pSmallFree;
        db->lookaside.pSmallFree = pBuf;
        return;
      }
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
      if( ((uptr)p)>=(uptr)(db->lookaside.pStart) ){
        LookasideSlot *pBuf = (LookasideSlot*)p;
        assert( db->pnBytesFreed==0 );
#ifdef SQLITE_DEBUG
        memset(p, 0xaa, db->lookaside.szTrue);  /* Trash freed content */
#endif
        pBuf->pNext = db->lookaside.pFree;
        db->lookaside.pFree = pBuf;
        return;
      }
    }
    if( db->pnBytesFreed ){
      measureAllocationSize(db, p);
      return;
    }
  }
  assert( sqlite3MemdebugHasType(p, (MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
  assert( sqlite3MemdebugNoType(p, (u8)~(MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
  assert( db!=0 || sqlite3MemdebugNoType(p, MEMTYPE_LOOKASIDE) );
  sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
  sqlite3_free(p);
}